

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

void __thiscall
pbrt::AnimatedShapeSceneEntity::AnimatedShapeSceneEntity
          (AnimatedShapeSceneEntity *this,AnimatedShapeSceneEntity *param_1)

{
  bool bVar1;
  undefined3 uVar2;
  int iVar3;
  
  TransformedSceneEntity::TransformedSceneEntity
            (&this->super_TransformedSceneEntity,&param_1->super_TransformedSceneEntity);
  bVar1 = param_1->reverseOrientation;
  uVar2 = *(undefined3 *)&param_1->field_0x361;
  iVar3 = param_1->materialIndex;
  this->identity = param_1->identity;
  this->reverseOrientation = bVar1;
  *(undefined3 *)&this->field_0x361 = uVar2;
  this->materialIndex = iVar3;
  std::__cxx11::string::string((string *)&this->materialName,(string *)&param_1->materialName);
  this->lightIndex = param_1->lightIndex;
  std::__cxx11::string::string((string *)&this->insideMedium,(string *)&param_1->insideMedium);
  std::__cxx11::string::string((string *)&this->outsideMedium,(string *)&param_1->outsideMedium);
  return;
}

Assistant:

AnimatedShapeSceneEntity(const std::string &name, ParameterDictionary parameters,
                             FileLoc loc, const AnimatedTransform &renderFromObject,
                             const Transform *identity, bool reverseOrientation,
                             int materialIndex, const std::string &materialName,
                             int lightIndex, const std::string &insideMedium,
                             const std::string &outsideMedium)
        : TransformedSceneEntity(name, parameters, loc, renderFromObject),
          identity(identity),
          reverseOrientation(reverseOrientation),
          materialIndex(materialIndex),
          materialName(materialName),
          lightIndex(lightIndex),
          insideMedium(insideMedium),
          outsideMedium(outsideMedium) {}